

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

bool InliningDecider::IsInlineeLeaf(FunctionBody *inlinee)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  DynamicProfileInfo *this;
  
  if ((inlinee->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    return false;
  }
  sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,InlineBuiltInCallerPhase,sourceContextId,functionId);
  if (bVar1) {
    if (inlinee->profiledCallSiteCount == 0) {
LAB_00513700:
      this = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee);
      bVar1 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this);
      return !bVar1;
    }
  }
  else {
    bVar1 = Js::FunctionBody::HasNonBuiltInCallee(inlinee);
    if (!bVar1) goto LAB_00513700;
  }
  return false;
}

Assistant:

bool HasDynamicProfileInfo() const { return dynamicProfileInfo != nullptr; }